

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

int __thiscall helics::CoreBroker::getCountableFederates(CoreBroker *this)

{
  bool bVar1;
  long in_RDI;
  BasicFedInfo *fed;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *__range1;
  int cnt;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_20;
  long local_18;
  int local_c;
  
  local_c = 0;
  local_18 = in_RDI + 0x2a8;
  local_20._M_current =
       (BasicFedInfo *)
       gmlc::containers::
       DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
       ::begin(in_stack_ffffffffffffffc8);
  gmlc::containers::
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                      ((__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
         ::operator*(&local_20);
    if ((in_stack_ffffffffffffffd0->nonCounting & 1U) == 0) {
      local_c = local_c + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
    ::operator++(&local_20);
  }
  return local_c;
}

Assistant:

int CoreBroker::getCountableFederates() const
{
    int cnt{0};
    for (const auto& fed : mFederates) {
        if (!fed.nonCounting) {
            ++cnt;
        }
    }
    return cnt;
}